

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O3

void __thiscall
RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::populate
          (RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this)

{
  pointer pcVar1;
  pointer pvVar2;
  iterator __position;
  uint uVar3;
  result_type rVar4;
  ulong uVar5;
  size_t __i;
  long lVar6;
  size_t length;
  size_t sVar7;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  mt19937 randgen;
  vector<char16_t,_std::allocator<char16_t>_> local_13f8;
  param_type local_13e0;
  param_type local_13d8;
  vector<char16_t,_std::allocator<char16_t>_> local_13d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::
  vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
  ::_M_erase_at_end(&this->m_tokens,
                    (this->m_tokens).
                    super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pcVar1 = (this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  uVar3 = std::chrono::_V2::system_clock::now();
  local_13b8._M_x[0] = (unsigned_long)uVar3;
  lVar6 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar6);
    local_13b8._M_x[lVar6] = uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_13b8._M_p = 0x270;
  local_13d8._M_a = 5;
  local_13d8._M_b = 0x40;
  local_13e0._M_a = 0;
  local_13e0._M_b = 0x10;
  sVar7 = this->m_fixed_word_count;
  if (sVar7 == 0) {
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_13d8,&local_13b8,&local_13d8
                      );
    sVar7 = (size_t)rVar4;
  }
  if ((ulong)(((long)(this->m_tokens).
                     super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_tokens).
                     super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < sVar7)
  {
    do {
      length = this->m_fixed_word_length;
      if (length == 0) {
        rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_13e0,&local_13b8,
                           &local_13e0);
        length = (size_t)rVar4;
      }
      std::vector<char16_t,_std::allocator<char16_t>_>::vector(&local_13d0,&this->m_delim);
      make_word<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>,_std::vector<char16_t,_std::allocator<char16_t>_>,_nullptr>
                (&local_13f8,&local_13d0,length);
      std::
      vector<std::vector<char16_t,std::allocator<char16_t>>,std::allocator<std::vector<char16_t,std::allocator<char16_t>>>>
      ::emplace_back<std::vector<char16_t,std::allocator<char16_t>>>
                ((vector<std::vector<char16_t,std::allocator<char16_t>>,std::allocator<std::vector<char16_t,std::allocator<char16_t>>>>
                  *)&this->m_tokens,&local_13f8);
      if (local_13f8.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_13f8.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_13f8.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_13f8.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_13d0.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_13d0.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_13d0.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_13d0.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar2 = (this->m_tokens).
               super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar1 = pvVar2[-1].super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar1 == pvVar2[-1].super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        (this->m_tokens).
        super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar2 + -1;
        if (pcVar1 != (pointer)0x0) {
          operator_delete(pcVar1,(long)pvVar2[-1].
                                       super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pcVar1);
        }
      }
      else {
        local_13f8.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)(this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1);
        __position._M_current =
             (this->m_token_indexes).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_token_indexes).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&this->m_token_indexes,__position,(unsigned_long *)&local_13f8);
        }
        else {
          *__position._M_current =
               (unsigned_long)
               local_13f8.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
               super__Vector_impl_data._M_start;
          (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pvVar2 = (this->m_tokens).
                 super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::vector<char16_t,std::allocator<char16_t>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char16_t*,std::vector<char16_t,std::allocator<char16_t>>>>
                  ((vector<char16_t,std::allocator<char16_t>> *)&this->m_str,
                   (this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   pvVar2[-1].super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   pvVar2[-1].super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      std::vector<char16_t,std::allocator<char16_t>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char16_t*,std::vector<char16_t,std::allocator<char16_t>>>>
                ((vector<char16_t,std::allocator<char16_t>> *)&this->m_str,
                 (this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (this->m_delim).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->m_delim).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    } while ((ulong)(((long)(this->m_tokens).
                            super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_tokens).
                            super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
             sVar7);
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(m_delim, word_length));
			if (m_tokens.back().empty()) {
				m_tokens.pop_back();
			}
			else {
				m_token_indexes.push_back(m_str.size());
				m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			}
			m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
		}
	}